

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_inst.h
# Opt level: O3

void __thiscall
mocker::ir::Call::Call<std::shared_ptr<mocker::ir::Addr>>
          (Call *this,string *funcName,shared_ptr<mocker::ir::Addr> *args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  initializer_list<std::shared_ptr<mocker::ir::Addr>_> __l;
  allocator_type local_29;
  shared_ptr<mocker::ir::Addr> local_28;
  
  (this->super_IRInst).type = Call;
  (this->super_Definition).dest.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->super_Definition).dest.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_IRInst)._vptr_IRInst = (_func_int **)&PTR__Call_001e98d0;
  (this->super_Definition)._vptr_Definition = (_func_int **)&PTR__Call_001e98f0;
  paVar1 = &(this->funcName).field_2;
  (this->funcName)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (funcName->_M_dataplus)._M_p;
  paVar2 = &funcName->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&funcName->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->funcName).field_2 + 8) = uVar4;
  }
  else {
    (this->funcName)._M_dataplus._M_p = pcVar3;
    (this->funcName).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->funcName)._M_string_length = funcName->_M_string_length;
  (funcName->_M_dataplus)._M_p = (pointer)paVar2;
  funcName->_M_string_length = 0;
  (funcName->field_2)._M_local_buf[0] = '\0';
  local_28.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (args->super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_28.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (args->super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (args->super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (args->super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  __l._M_len = 1;
  __l._M_array = &local_28;
  std::
  vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>::
  vector(&this->args,__l,&local_29);
  if (local_28.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  return;
}

Assistant:

explicit Call(std::string funcName, Args... args)
      : IRInst(InstType::Call), Definition(nullptr),
        funcName(std::move(funcName)), args({std::move(args)...}) {}